

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

string * nonius::html_reporter::escape(string *source)

{
  initializer_list<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  int iVar1;
  string *in_RDI;
  key_equal *in_stack_fffffffffffffe78;
  hasher *in_stack_fffffffffffffe80;
  size_type in_stack_fffffffffffffe88;
  unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe90;
  iterator in_stack_fffffffffffffe98;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffea0;
  undefined8 **ppuVar2;
  undefined1 **local_158;
  allocator_type *__a;
  allocator_type local_134 [3];
  undefined1 local_131;
  undefined1 local_130;
  undefined1 local_12f;
  undefined1 local_12e;
  undefined1 local_12d;
  undefined1 local_119;
  undefined8 *local_118;
  undefined1 *local_110 [5];
  undefined1 local_e8 [40];
  undefined1 local_c0 [40];
  undefined1 local_98 [40];
  undefined1 local_70 [32];
  unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  undefined8 *local_20;
  undefined8 local_18;
  
  if (escape(std::__cxx11::string_const&)::escapes_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&escape(std::__cxx11::string_const&)::escapes_abi_cxx11_);
    if (iVar1 != 0) {
      local_118 = local_110;
      local_119 = 0x27;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[7],_true>
                (in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->first,
                 (char (*) [7])in_stack_fffffffffffffe90);
      local_118 = (undefined8 *)local_e8;
      local_12d = 0x22;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[7],_true>
                (in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->first,
                 (char (*) [7])in_stack_fffffffffffffe90);
      local_118 = (undefined8 *)local_c0;
      local_12e = 0x3c;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[5],_true>
                (in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->first,
                 (char (*) [5])in_stack_fffffffffffffe90);
      local_118 = (undefined8 *)local_98;
      local_12f = 0x3e;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[5],_true>
                (in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->first,
                 (char (*) [5])in_stack_fffffffffffffe90);
      local_118 = (undefined8 *)local_70;
      local_130 = 0x26;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>
                (in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->first,
                 (char (*) [6])in_stack_fffffffffffffe90);
      local_118 = (undefined8 *)&stack0xffffffffffffffb8;
      local_131 = 0x5c;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[3],_true>
                (in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->first,
                 (char (*) [3])in_stack_fffffffffffffe90);
      local_20 = local_110;
      local_18 = 6;
      __a = local_134;
      std::
      allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator((allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x1fd981);
      __l._M_len = (size_type)in_stack_fffffffffffffea0;
      __l._M_array = in_stack_fffffffffffffe98;
      std::
      unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unordered_map(in_stack_fffffffffffffe90,__l,in_stack_fffffffffffffe88,
                      in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,__a);
      std::
      allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator((allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x1fd9c2);
      ppuVar2 = (undefined8 **)local_110;
      local_158 = (undefined1 **)&local_20;
      do {
        local_158 = local_158 + -5;
        std::
        pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1fd9ed);
      } while ((undefined8 **)local_158 != ppuVar2);
      __cxa_atexit(std::
                   unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,&escape(std::__cxx11::string_const&)::escapes_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&escape(std::__cxx11::string_const&)::escapes_abi_cxx11_);
    }
  }
  nonius::detail::escape(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  return in_RDI;
}

Assistant:

static std::string escape(std::string const& source) {
            static const std::unordered_map<char, std::string> escapes {
                { '\'', "&apos;" },
                { '"',  "&quot;" },
                { '<',  "&lt;"   },
                { '>',  "&gt;"   },
                { '&',  "&amp;"  },
                { '\\',  "\\\\"  },
            };
            return detail::escape(source, escapes);
        }